

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult aa64_zva_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t hcr;
  int cur_el;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_current_el(env);
  if (iVar1 < 2) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if (iVar1 == 0) {
      if ((uVar2 & 0x408000000) == 0x408000000) {
        if (((env->cp15).field_2.field_0.hsctlr & 0x4000) == 0) {
          return CP_ACCESS_TRAP_EL2;
        }
      }
      else {
        if (((env->cp15).field_2.field_0.sctlr_ns & 0x4000) == 0) {
          return CP_ACCESS_TRAP;
        }
        if ((uVar2 & 0x10000000) != 0) {
          return CP_ACCESS_TRAP_EL2;
        }
      }
    }
    else if ((uVar2 & 0x10000000) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult aa64_zva_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TDZ) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TDZ) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}